

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::ASTContext::requireValidBitWidth(ASTContext *this,SVInt *value,SourceRange range)

{
  SourceRange sourceRange;
  SourceRange range_00;
  bool bVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  undefined8 in_RCX;
  ASTContext *in_RDX;
  optional<unsigned_int> result;
  undefined8 in_stack_ffffffffffffffa8;
  int arg;
  Diagnostic *in_stack_ffffffffffffffb0;
  ASTContext *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  _Optional_payload_base<unsigned_int> local_8;
  
  arg = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  _Var2 = (_Optional_payload_base<unsigned_int>)
          SVInt::as<unsigned_int>((SVInt *)in_stack_ffffffffffffffb8);
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x10fc4aa);
  if (bVar1) {
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x10fc4fc);
    range_00.endLoc._0_4_ = in_stack_ffffffffffffffc8;
    range_00.startLoc = (SourceLocation)in_stack_ffffffffffffffc0;
    range_00.endLoc._4_4_ = in_stack_ffffffffffffffcc;
    bVar1 = requireValidBitWidth
                      (in_stack_ffffffffffffffb8,(bitwidth_t)((ulong)in_RCX >> 0x20),range_00);
    if (!bVar1) {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
      _Var2 = local_8;
    }
  }
  else {
    sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffc8;
    sourceRange.startLoc = (SourceLocation)in_RCX;
    sourceRange.endLoc._4_4_ = 0x60003;
    addDiag(in_RDX,_Var2._4_4_,sourceRange);
    Diagnostic::operator<<<int>(in_stack_ffffffffffffffb0,arg);
  }
  local_8 = _Var2;
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> ASTContext::requireValidBitWidth(const SVInt& value,
                                                           SourceRange range) const {
    auto result = value.as<bitwidth_t>();
    if (!result)
        addDiag(diag::ValueExceedsMaxBitWidth, range) << (int)SVInt::MAX_BITS;
    else if (!requireValidBitWidth(*result, range))
        return std::nullopt;
    return result;
}